

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_memrchr.c
# Opt level: O3

void * Curl_memrchr(void *s,int c,size_t n)

{
  char *pcVar1;
  
  if (n != 0) {
    pcVar1 = (char *)(n + (long)s);
    while (pcVar1 = pcVar1 + -1, s <= pcVar1) {
      if (*pcVar1 == (char)c) {
        return pcVar1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
Curl_memrchr(const void *s, int c, size_t n)
{
  if(n > 0) {
    const unsigned char *p = s;
    const unsigned char *q = s;

    p += n - 1;

    while(p >= q) {
      if(*p == (unsigned char)c)
        return (void *)p;
      p--;
    }
  }
  return NULL;
}